

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void cs::foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  stack_pointer psVar2;
  _Elt_pointer ppsVar3;
  statement_base *psVar4;
  undefined *puVar5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar6;
  _Elt_pointer ppsVar7;
  stack_pointer this;
  _Elt_pointer ppsVar8;
  _Map_pointer pppsVar9;
  scope_guard scope;
  var *local_c8;
  scope_guard local_c0;
  _Map_pointer local_b8;
  _Elt_pointer local_b0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a8;
  _Elt_pointer local_a0;
  string *local_98;
  
  local_a8 = body;
  local_98 = iterator;
  pdVar6 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(obj);
  if ((pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    psVar2 = *(peVar1->super_runtime_type).storage.fiber_stack;
    this = &(peVar1->super_runtime_type).storage.m_data;
    if (psVar2 != (stack_pointer)0x0) {
      this = psVar2;
    }
    local_c0.context = context;
    stack_type<cs::domain_type,_std::allocator>::push<>(this);
    pdVar6 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(obj);
    local_c8 = (pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    local_a0 = (pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    if (local_c8 != local_a0) {
      local_b0 = (pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      local_b8 = (pdVar6->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      do {
        puVar5 = current_process;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
        }
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,local_98,local_c8);
        ppsVar7 = (local_a8->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        ppsVar3 = (local_a8->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppsVar7 != ppsVar3) {
          ppsVar8 = (local_a8->
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_last;
          pppsVar9 = (local_a8->
                     super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            puVar5 = current_process;
            psVar4 = *ppsVar7;
            if ((*current_process & 1) != 0) {
              LOCK();
              *current_process = 0;
              UNLOCK();
              event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
            }
            (*psVar4->_vptr_statement_base[3])(psVar4);
            peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar1->return_fcall != false) goto LAB_002afc54;
            if (peVar1->break_block == true) {
              peVar1->break_block = false;
              goto LAB_002afc54;
            }
            if (peVar1->continue_block != false) {
              peVar1->continue_block = false;
              break;
            }
            ppsVar7 = ppsVar7 + 1;
            if (ppsVar7 == ppsVar8) {
              ppsVar7 = pppsVar9[1];
              pppsVar9 = pppsVar9 + 1;
              ppsVar8 = ppsVar7 + 0x40;
            }
          } while (ppsVar7 != ppsVar3);
        }
        domain_manager::next_domain
                  (&((((((local_c0.context)->
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_runtime_type).storage);
        local_c8 = local_c8 + 1;
        if (local_c8 == local_b0) {
          local_c8 = local_b8[1];
          local_b8 = local_b8 + 1;
          local_b0 = local_c8 + 0x40;
        }
      } while (local_c8 != local_a0);
    }
LAB_002afc54:
    scope_guard::~scope_guard(&local_c0);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}